

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O2

void __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::AddMedoid
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,size_t medoid)

{
  pointer puVar1;
  uint __line;
  pointer puVar2;
  char *__assertion;
  size_t object;
  ulong i;
  DistanceType DVar3;
  size_t medoid_local;
  float local_14;
  
  medoid_local = medoid;
  if (this->state < Swapping) {
    if (medoid < this->matrix->size) {
      puVar2 = (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->medoids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->state != Initializing) == (puVar2 == puVar1)) {
        __assertion = "medoids.empty() == ( State() == Initializing )";
        __line = 0x5b;
      }
      else {
        if ((ulong)((long)puVar1 - (long)puVar2 >> 3) < this->numberOfClusters) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&this->medoids,&medoid_local);
          if (this->state == Initializing) {
            puVar1 = (this->objectMedoids).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar2 = (this->objectMedoids).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
              *puVar2 = 0;
            }
            this->state = Building;
          }
          else {
            for (i = 0; i < this->matrix->size; i = i + 1) {
              if (i != (this->objectMedoids).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[i]) {
                local_14 = CDissimilarityMatrix<float>::Distance(this->matrix,i,medoid_local);
                DVar3 = distanceToMedoid(this,i);
                if (local_14 < DVar3) {
                  (this->objectMedoids).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[i] = medoid_local;
                }
              }
            }
            if ((long)(this->medoids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->medoids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3 == this->numberOfClusters) {
              this->state = Swapping;
              findObjectMedoids(this);
            }
          }
          return;
        }
        __assertion = "medoids.size() < NumberOfClusters()";
        __line = 0x5c;
      }
    }
    else {
      __assertion = "medoid < NumberOfObjects()";
      __line = 0x5a;
    }
  }
  else {
    __assertion = "State() == Initializing || State() == Building";
    __line = 0x59;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                ,__line,
                "void CPartitioningAroundMedois<CDissimilarityMatrix<float>>::AddMedoid(size_t) [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
               );
}

Assistant:

void CPartitioningAroundMedois<DMT>::AddMedoid( size_t medoid )
{
	assert( State() == Initializing || State() == Building );
	assert( medoid < NumberOfObjects() );
	assert( medoids.empty() == ( State() == Initializing ) );
	assert( medoids.size() < NumberOfClusters() );

	medoids.push_back( medoid );

	if( State() == Initializing ) {
		fill( objectMedoids.begin(), objectMedoids.end(), 0 );
		state = Building;
	} else {
		// calculate new objectMedoids
		for( size_t object = 0; object < NumberOfObjects(); object++ ) {
			if( IsMedoid( object ) ) {
				continue; // if object is medoid
			}

			if( matrix.Distance( object, medoid ) < distanceToMedoid( object ) ) {
				objectMedoids[object] = medoid;
			}
		}

		if( medoids.size() == NumberOfClusters() ) {
			state = Swapping;

			findObjectMedoids();
		}
	}
}